

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> * __thiscall
immutable::ref<immutable::rrb_details::internal_node<immutable::vector<char,false,5>,true>>::
operator=(ref<immutable::rrb_details::internal_node<immutable::vector<char,false,5>,true>> *this,
         ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_5>,_true>_> *r)

{
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> local_20;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> temp;
  ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_5>,_true>_> *r_local;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> *this_local;
  
  temp.ptr = (internal_node<immutable::vector<char,_false,_5>,_true> *)r;
  ref<immutable::rrb_details::leaf_node<immutable::vector<char,false,5>,true>>
            ((ref<immutable::rrb_details::internal_node<immutable::vector<char,false,5>,true>> *)
             &local_20,r);
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::swap
            ((ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> *
             )this,&local_20);
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::~ref
            (&local_20);
  return (ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> *)
         this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<U>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }